

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

BVSparseNode * __thiscall
BVSparse<Memory::Recycler>::NodeFromIndex
          (BVSparse<Memory::Recycler> *this,BVIndex i,Type **prevNextFieldOut)

{
  BVSparseNode<Memory::Recycler> *pBVar1;
  bool bVar2;
  BVIndex BVar3;
  BVSparseNode<Memory::Recycler> **ppBVar4;
  BVSparseNode *lastNode;
  BVSparseNode *curNode;
  Type *prevLastField;
  Type *prevNextField;
  BVIndex searchIndex;
  Type **prevNextFieldOut_local;
  BVIndex i_local;
  BVSparse<Memory::Recycler> *this_local;
  
  BVar3 = BVUnitT<unsigned_long>::Floor(i);
  ppBVar4 = Memory::WriteBarrierPtr::operator_cast_to_BVSparseNode__((WriteBarrierPtr *)this);
  lastNode = *ppBVar4;
  ppBVar4 = Memory::WriteBarrierPtr::operator_cast_to_BVSparseNode__
                      ((WriteBarrierPtr *)&this->lastFoundIndex);
  pBVar1 = *ppBVar4;
  prevLastField = &this->head;
  if (lastNode == (BVSparseNode<Memory::Recycler> *)0x0) {
    ppBVar4 = Memory::WriteBarrierPtr::operator_cast_to_BVSparseNode__((WriteBarrierPtr *)this);
    lastNode = *ppBVar4;
  }
  else {
    if (lastNode->startIndex == BVar3) {
      *prevNextFieldOut = &this->head;
      return lastNode;
    }
    if ((pBVar1 != (BVSparseNode<Memory::Recycler> *)0x0) &&
       (pBVar1->startIndex != lastNode->startIndex)) {
      if (pBVar1->startIndex == BVar3) {
        *prevNextFieldOut = &this->lastFoundIndex;
        return pBVar1;
      }
      if (pBVar1->startIndex < BVar3) {
        prevLastField = &this->lastFoundIndex;
        ppBVar4 = Memory::WriteBarrierPtr::operator_cast_to_BVSparseNode__
                            ((WriteBarrierPtr *)&this->lastFoundIndex);
        lastNode = *ppBVar4;
      }
    }
    if (BVar3 < lastNode->startIndex) {
      ppBVar4 = Memory::WriteBarrierPtr::operator_cast_to_BVSparseNode__((WriteBarrierPtr *)this);
      lastNode = *ppBVar4;
      prevLastField = &this->head;
    }
  }
  while( true ) {
    bVar2 = false;
    if (lastNode != (BVSparseNode *)0x0) {
      bVar2 = lastNode->startIndex < BVar3;
    }
    if (!bVar2) break;
    prevLastField = &lastNode->next;
    ppBVar4 = Memory::WriteBarrierPtr::operator_cast_to_BVSparseNode__((WriteBarrierPtr *)lastNode);
    lastNode = *ppBVar4;
  }
  Memory::WriteBarrierPtr<BVSparseNode<Memory::Recycler>_>::operator=
            (&this->lastFoundIndex,prevLastField);
  if ((lastNode == (BVSparseNode *)0x0) || (BVar3 != lastNode->startIndex)) {
    this_local = (BVSparse<Memory::Recycler> *)0x0;
  }
  else {
    *prevNextFieldOut = prevLastField;
    this_local = (BVSparse<Memory::Recycler> *)lastNode;
  }
  return (BVSparseNode *)this_local;
}

Assistant:

const BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator) const** prevNextFieldOut) const
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator) const* prevNextField = &this->head;
    Field(BVSparseNode*, TAllocator) const* prevLastField = &this->lastFoundIndex;

    const BVSparseNode * curNode  = *prevNextField,
                       * lastNode = *prevLastField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (lastNode && lastNode->startIndex != curNode->startIndex)
        {
            if (lastNode->startIndex == searchIndex)
            {
                *prevNextFieldOut = prevLastField;
                return lastNode;
            }

            if (lastNode->startIndex < searchIndex)
            {
                prevNextField = &this->lastFoundIndex;
                curNode = this->lastFoundIndex;
            }
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    const_cast<BVSparse<TAllocator>*>(this)->lastFoundIndex = *prevNextField;

    if (curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        return curNode;
    }

    return nullptr;
}